

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureBorderClampPerAxisCase3D::init
          (TextureBorderClampPerAxisCase3D *this,EVP_PKEY_CTX *ctx)

{
  PtrData<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_> data;
  PtrData<deqp::gls::TextureTestUtil::TextureRenderer,_de::DefaultDeleter<deqp::gls::TextureTestUtil::TextureRenderer>_>
  data_00;
  bool bVar1;
  CompressedTexFormat format;
  int iVar2;
  RenderContext *pRVar3;
  ContextInfo *pCVar4;
  NotSupportedError *pNVar5;
  RenderTarget *pRVar6;
  MovePtr *this_00;
  TextureRenderer *this_01;
  TestLog *pTVar7;
  MessageBuilder *pMVar8;
  Texture3D *pTVar9;
  Texture3D *pTVar10;
  reference pvVar11;
  TextureFormat *pTVar12;
  Texture3D *in_stack_fffffffffffff9a8;
  undefined8 in_stack_fffffffffffff9b0;
  Vector<float,_4> local_548;
  anon_union_16_3_1194ccdc_for_v local_538;
  undefined1 local_528 [8];
  TextureFormatInfo texFormatInfo;
  TextureFormat texFormat;
  int local_35c;
  int local_358;
  int local_354;
  char *local_350;
  MessageBuilder local_348;
  DefaultDeleter<deqp::gls::TextureTestUtil::TextureRenderer> local_1c1;
  PtrData<deqp::gls::TextureTestUtil::TextureRenderer,_de::DefaultDeleter<deqp::gls::TextureTestUtil::TextureRenderer>_>
  local_1c0;
  PtrData<deqp::gls::TextureTestUtil::TextureRenderer,_de::DefaultDeleter<deqp::gls::TextureTestUtil::TextureRenderer>_>
  *local_1b0;
  PtrData<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_> local_1a0;
  PtrData<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_> *local_190;
  undefined1 local_17d;
  int local_17c;
  string local_178;
  int local_154;
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  undefined1 local_aa;
  allocator<char> local_a9;
  string local_a8;
  undefined1 local_82;
  allocator<char> local_81;
  string local_80;
  undefined1 local_5d;
  allocator<char> local_49;
  string local_48;
  ApiType local_24;
  GLSLVersion local_20;
  deUint32 local_1c;
  GLSLVersion glslVersion;
  byte local_11;
  TextureBorderClampPerAxisCase3D *pTStack_10;
  bool supportsES32;
  TextureBorderClampPerAxisCase3D *this_local;
  
  pTStack_10 = this;
  pRVar3 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glslVersion = (*pRVar3->_vptr_RenderContext[2])();
  local_1c = (deUint32)glu::ApiType::es(3,2);
  local_11 = glu::contextSupports((ContextType)glslVersion,(ApiType)local_1c);
  pRVar3 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  local_24.m_bits = (*pRVar3->_vptr_RenderContext[2])();
  local_20 = glu::getContextTypeGLSLVersion((ContextType)local_24.m_bits);
  if ((local_11 & 1) == 0) {
    pCVar4 = gles31::Context::getContextInfo((this->super_TestCase).m_context);
    bVar1 = glu::ContextInfo::isExtensionSupported(pCVar4,"GL_EXT_texture_border_clamp");
    if (!bVar1) {
      local_5d = 1;
      pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"Test requires GL_EXT_texture_border_clamp extension",&local_49
                );
      tcu::NotSupportedError::NotSupportedError(pNVar5,&local_48);
      local_5d = 0;
      __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  bVar1 = glu::isCompressedFormat(this->m_texFormat);
  if ((bVar1) && ((local_11 & 1) == 0)) {
    format = glu::mapGLCompressedTexFormat(this->m_texFormat);
    bVar1 = tcu::isAstcFormat(format);
    if (bVar1) {
      pCVar4 = gles31::Context::getContextInfo((this->super_TestCase).m_context);
      bVar1 = glu::ContextInfo::isExtensionSupported(pCVar4,"GL_KHR_texture_compression_astc_ldr");
      if (!bVar1) {
        local_82 = 1;
        pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_80,"Test requires GL_KHR_texture_compression_astc_ldr extension"
                   ,&local_81);
        tcu::NotSupportedError::NotSupportedError(pNVar5,&local_80);
        local_82 = 0;
        __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,
                    tcu::NotSupportedError::~NotSupportedError);
      }
    }
  }
  if (this->m_texFormat == 0x80e1) {
    pCVar4 = gles31::Context::getContextInfo((this->super_TestCase).m_context);
    bVar1 = glu::ContextInfo::isExtensionSupported(pCVar4,"GL_EXT_texture_format_BGRA8888");
    if (!bVar1) {
      local_aa = 1;
      pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,"Test requires GL_EXT_texture_format_BGRA8888 extension",
                 &local_a9);
      tcu::NotSupportedError::NotSupportedError(pNVar5,&local_a8);
      local_aa = 0;
      __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  pRVar6 = gles31::Context::getRenderTarget((this->super_TestCase).m_context);
  iVar2 = tcu::RenderTarget::getWidth(pRVar6);
  if (0x7f < iVar2) {
    pRVar6 = gles31::Context::getRenderTarget((this->super_TestCase).m_context);
    iVar2 = tcu::RenderTarget::getHeight(pRVar6);
    if (0x7f < iVar2) {
      this_00 = (MovePtr *)gles31::Context::getRenderContext((this->super_TestCase).m_context);
      pCVar4 = gles31::Context::getContextInfo((this->super_TestCase).m_context);
      genDummyTexture<glu::Texture3D>
                ((MovePtr<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_> *)&local_1a0,
                 (RenderContext *)this_00,pCVar4,this->m_texFormat,&this->m_size);
      local_190 = de::details::MovePtr::operator_cast_to_PtrData(&local_1a0,this_00);
      data._8_8_ = in_stack_fffffffffffff9b0;
      data.ptr = in_stack_fffffffffffff9a8;
      de::details::MovePtr<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>::operator=
                (&this->m_texture,data);
      de::details::MovePtr<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>::~MovePtr
                ((MovePtr<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_> *)&local_1a0);
      this_01 = (TextureRenderer *)operator_new(0x58);
      pRVar3 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
      pTVar7 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      deqp::gls::TextureTestUtil::TextureRenderer::TextureRenderer
                (this_01,pRVar3,pTVar7,local_20,PRECISION_HIGHP);
      de::DefaultDeleter<deqp::gls::TextureTestUtil::TextureRenderer>::DefaultDeleter(&local_1c1);
      de::details::
      MovePtr<deqp::gls::TextureTestUtil::TextureRenderer,_de::DefaultDeleter<deqp::gls::TextureTestUtil::TextureRenderer>_>
      ::MovePtr();
      local_1b0 = de::details::MovePtr::operator_cast_to_PtrData(&local_1c0,(MovePtr *)this_01);
      data_00._8_8_ = in_stack_fffffffffffff9b0;
      data_00.ptr = (TextureRenderer *)in_stack_fffffffffffff9a8;
      de::details::
      MovePtr<deqp::gls::TextureTestUtil::TextureRenderer,_de::DefaultDeleter<deqp::gls::TextureTestUtil::TextureRenderer>_>
      ::operator=(&this->m_renderer,data_00);
      de::details::
      MovePtr<deqp::gls::TextureTestUtil::TextureRenderer,_de::DefaultDeleter<deqp::gls::TextureTestUtil::TextureRenderer>_>
      ::~MovePtr((MovePtr<deqp::gls::TextureTestUtil::TextureRenderer,_de::DefaultDeleter<deqp::gls::TextureTestUtil::TextureRenderer>_>
                  *)&local_1c0);
      pTVar7 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<(&local_348,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar8 = tcu::MessageBuilder::operator<<
                         (&local_348,(char (*) [32])"Created 3D texture with format ");
      local_350 = glu::getTextureFormatName(this->m_texFormat);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_350);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [9])", size (");
      pTVar9 = de::details::UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>::
               operator->(&(this->m_texture).
                           super_UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>);
      pTVar10 = glu::Texture3D::getRefTexture(pTVar9);
      local_354 = tcu::Texture3D::getWidth(pTVar10);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_354);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a4b1eb);
      pTVar9 = de::details::UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>::
               operator->(&(this->m_texture).
                           super_UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>);
      pTVar10 = glu::Texture3D::getRefTexture(pTVar9);
      local_358 = tcu::Texture3D::getHeight(pTVar10);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_358);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2a4b1eb);
      pTVar9 = de::details::UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>::
               operator->(&(this->m_texture).
                           super_UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>);
      pTVar10 = glu::Texture3D::getRefTexture(pTVar9);
      local_35c = tcu::Texture3D::getDepth(pTVar10);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,&local_35c);
      pMVar8 = tcu::MessageBuilder::operator<<(pMVar8,(char (*) [3])0x2c2d560);
      tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_348);
      pTVar7 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      pMVar8 = (MessageBuilder *)&texFormat;
      tcu::TestLog::operator<<(pMVar8,pTVar7,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar8 = tcu::MessageBuilder::operator<<
                         (pMVar8,(char (*) [71])
                                 "Setting tex coords bottom-left: (-1, -1, -1.5), top-right (2, 2, 2.5)\n"
                         );
      tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&texFormat);
      std::vector<float,_std::allocator<float>_>::resize(&this->m_texCoords,0xc);
      pvVar11 = std::vector<float,_std::allocator<float>_>::operator[](&this->m_texCoords,0);
      *pvVar11 = -1.0;
      pvVar11 = std::vector<float,_std::allocator<float>_>::operator[](&this->m_texCoords,1);
      *pvVar11 = -1.0;
      pvVar11 = std::vector<float,_std::allocator<float>_>::operator[](&this->m_texCoords,2);
      *pvVar11 = -1.5;
      pvVar11 = std::vector<float,_std::allocator<float>_>::operator[](&this->m_texCoords,3);
      *pvVar11 = -1.0;
      pvVar11 = std::vector<float,_std::allocator<float>_>::operator[](&this->m_texCoords,4);
      *pvVar11 = 2.0;
      pvVar11 = std::vector<float,_std::allocator<float>_>::operator[](&this->m_texCoords,5);
      *pvVar11 = 0.5;
      pvVar11 = std::vector<float,_std::allocator<float>_>::operator[](&this->m_texCoords,6);
      *pvVar11 = 2.0;
      pvVar11 = std::vector<float,_std::allocator<float>_>::operator[](&this->m_texCoords,7);
      *pvVar11 = -1.0;
      pvVar11 = std::vector<float,_std::allocator<float>_>::operator[](&this->m_texCoords,8);
      *pvVar11 = 0.5;
      pvVar11 = std::vector<float,_std::allocator<float>_>::operator[](&this->m_texCoords,9);
      *pvVar11 = 2.0;
      pvVar11 = std::vector<float,_std::allocator<float>_>::operator[](&this->m_texCoords,10);
      *pvVar11 = 2.0;
      pvVar11 = std::vector<float,_std::allocator<float>_>::operator[](&this->m_texCoords,0xb);
      *pvVar11 = 2.5;
      pTVar9 = de::details::UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>::
               operator->(&(this->m_texture).
                           super_UniqueBase<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>);
      pTVar10 = glu::Texture3D::getRefTexture(pTVar9);
      pTVar12 = tcu::TextureLevelPyramid::getFormat(&pTVar10->super_TextureLevelPyramid);
      texFormatInfo.lookupBias.m_data._8_8_ = *pTVar12;
      tcu::getTextureFormatInfo
                ((TextureFormatInfo *)local_528,
                 (TextureFormat *)(texFormatInfo.lookupBias.m_data + 2));
      tcu::Vector<float,_4>::Vector(&local_548,0.2,0.6,0.9,0.4);
      local_538 = (anon_union_16_3_1194ccdc_for_v)
                  mapToFormatColorRepresentable
                            ((TextureFormat *)(texFormatInfo.lookupBias.m_data + 2),&local_548);
      rr::GenericVec4::operator=(&this->m_borderColor,(GenericVec4 *)&local_538);
      *(undefined8 *)(this->m_lookupScale).m_data = texFormatInfo.valueMax.m_data._8_8_;
      *(undefined8 *)((this->m_lookupScale).m_data + 2) = texFormatInfo.lookupScale.m_data._0_8_;
      *(undefined8 *)(this->m_lookupBias).m_data = texFormatInfo.lookupScale.m_data._8_8_;
      *(undefined8 *)((this->m_lookupBias).m_data + 2) = texFormatInfo.lookupBias.m_data._0_8_;
      return (int)this;
    }
  }
  local_17d = 1;
  pNVar5 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  local_154 = 0x80;
  de::toString<int>(&local_150,&local_154);
  std::operator+(&local_130,"Test requires ",&local_150);
  std::operator+(&local_110,&local_130,"x");
  local_17c = 0x80;
  de::toString<int>(&local_178,&local_17c);
  std::operator+(&local_f0,&local_110,&local_178);
  std::operator+(&local_d0,&local_f0," viewport");
  tcu::NotSupportedError::NotSupportedError(pNVar5,&local_d0);
  local_17d = 0;
  __cxa_throw(pNVar5,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

void TextureBorderClampPerAxisCase3D::init (void)
{
	const bool				supportsES32	= glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));
	const glu::GLSLVersion	glslVersion		= glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType());

	if (!supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_EXT_texture_border_clamp"))
		throw tcu::NotSupportedError("Test requires GL_EXT_texture_border_clamp extension");

	if (glu::isCompressedFormat(m_texFormat)													&&
		!supportsES32																			&&
		tcu::isAstcFormat(glu::mapGLCompressedTexFormat(m_texFormat))							&&
		!m_context.getContextInfo().isExtensionSupported("GL_KHR_texture_compression_astc_ldr"))
	{
		throw tcu::NotSupportedError("Test requires GL_KHR_texture_compression_astc_ldr extension");
	}
	if (m_texFormat == GL_BGRA && !m_context.getContextInfo().isExtensionSupported("GL_EXT_texture_format_BGRA8888"))
		throw tcu::NotSupportedError("Test requires GL_EXT_texture_format_BGRA8888 extension");
	if (m_context.getRenderTarget().getWidth() < VIEWPORT_WIDTH ||
		m_context.getRenderTarget().getHeight() < VIEWPORT_HEIGHT)
	{
		throw tcu::NotSupportedError("Test requires " + de::toString<int>(VIEWPORT_WIDTH) + "x" + de::toString<int>(VIEWPORT_HEIGHT) + " viewport");
	}

	// resources
	m_texture = genDummyTexture<glu::Texture3D>(m_context.getRenderContext(), m_context.getContextInfo(), m_texFormat, m_size);
	m_renderer = de::MovePtr<gls::TextureTestUtil::TextureRenderer>(new gls::TextureTestUtil::TextureRenderer(m_context.getRenderContext(), m_testCtx.getLog(), glslVersion, glu::PRECISION_HIGHP));

	// texture info
	m_testCtx.getLog()	<< tcu::TestLog::Message
						<< "Created 3D texture with format " << glu::getTextureFormatName(m_texFormat)
						<< ", size (" << m_texture->getRefTexture().getWidth() << ", " << m_texture->getRefTexture().getHeight() << ", " << m_texture->getRefTexture().getDepth() << ")\n"
						<< tcu::TestLog::EndMessage;

	// tex coord
	{
		m_testCtx.getLog()	<< tcu::TestLog::Message
							<< "Setting tex coords bottom-left: (-1, -1, -1.5), top-right (2, 2, 2.5)\n"
							<< tcu::TestLog::EndMessage;

		m_texCoords.resize(4*3);

		m_texCoords[0] = -1.0f; m_texCoords[ 1] = -1.0f; m_texCoords[ 2] = -1.5f;
		m_texCoords[3] = -1.0f; m_texCoords[ 4] =  2.0f; m_texCoords[ 5] = 0.5f;
		m_texCoords[6] =  2.0f; m_texCoords[ 7] = -1.0f; m_texCoords[ 8] = 0.5f;
		m_texCoords[9] =  2.0f; m_texCoords[10] =  2.0f; m_texCoords[11] =  2.5f;
	}

	// set render params
	{
		const tcu::TextureFormat		texFormat		= m_texture->getRefTexture().getFormat();
		const tcu::TextureFormatInfo	texFormatInfo	= tcu::getTextureFormatInfo(texFormat);

		m_borderColor	= mapToFormatColorRepresentable(texFormat, tcu::Vec4(0.2f, 0.6f, 0.9f, 0.4f));

		m_lookupScale	= texFormatInfo.lookupScale;
		m_lookupBias	= texFormatInfo.lookupBias;
	}
}